

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::SingleKdTreeIndex::ByteSizeLong(SingleKdTreeIndex *this)

{
  int32 iVar1;
  int iVar2;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  SingleKdTreeIndex *this_local;
  
  sStack_18 = 0;
  iVar1 = leafsize(this);
  if (iVar1 != 0) {
    iVar1 = leafsize(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::Int32Size(iVar1);
    sStack_18 = sStack_18 + 1;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t SingleKdTreeIndex::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SingleKdTreeIndex)
  size_t total_size = 0;

  // int32 leafSize = 1;
  if (this->leafsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->leafsize());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}